

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_v7tar.c
# Opt level: O2

int archive_write_v7tar_header(archive_write *a,archive_entry *entry)

{
  la_int64_t *plVar1;
  size_t sVar2;
  char cVar3;
  mode_t mVar4;
  wchar_t wVar5;
  int iVar6;
  archive_string_conv *sc;
  char *pcVar7;
  size_t sVar8;
  archive_string *paVar9;
  int *piVar10;
  char *pcVar11;
  la_int64_t lVar12;
  time_t v;
  long lVar13;
  uint uVar14;
  int iVar15;
  char cVar16;
  size_t copy_length;
  char *p;
  char *local_240;
  char buff [512];
  
  plVar1 = (la_int64_t *)a->format_data;
  sc = (archive_string_conv *)plVar1[2];
  if (sc == (archive_string_conv *)0x0) {
    if ((int)plVar1[4] == 0) {
      sc = archive_string_default_conversion_for_write(&a->archive);
      plVar1[3] = (la_int64_t)sc;
      *(undefined4 *)(plVar1 + 4) = 1;
    }
    else {
      sc = (archive_string_conv *)plVar1[3];
    }
  }
  pcVar7 = archive_entry_pathname(entry);
  if (pcVar7 == (char *)0x0) {
    archive_set_error(&a->archive,-1,"Can\'t record entry in tar file without pathname");
    return -0x19;
  }
  pcVar7 = archive_entry_hardlink(entry);
  if (((pcVar7 != (char *)0x0) || (pcVar7 = archive_entry_symlink(entry), pcVar7 != (char *)0x0)) ||
     (mVar4 = archive_entry_filetype(entry), mVar4 != 0x8000)) {
    archive_entry_set_size(entry,0);
  }
  mVar4 = archive_entry_filetype(entry);
  if (((mVar4 == 0x4000) && (pcVar7 = archive_entry_pathname(entry), pcVar7 != (char *)0x0)) &&
     ((*pcVar7 != '\0' && (sVar8 = strlen(pcVar7), pcVar7[sVar8 - 1] != '/')))) {
    buff[0] = '\0';
    buff[1] = '\0';
    buff[2] = '\0';
    buff[3] = '\0';
    buff[4] = '\0';
    buff[5] = '\0';
    buff[6] = '\0';
    buff[7] = '\0';
    buff[8] = '\0';
    buff[9] = '\0';
    buff[10] = '\0';
    buff[0xb] = '\0';
    buff[0xc] = '\0';
    buff[0xd] = '\0';
    buff[0xe] = '\0';
    buff[0xf] = '\0';
    buff[0x10] = '\0';
    buff[0x11] = '\0';
    buff[0x12] = '\0';
    buff[0x13] = '\0';
    buff[0x14] = '\0';
    buff[0x15] = '\0';
    buff[0x16] = '\0';
    buff[0x17] = '\0';
    sVar8 = strlen(pcVar7);
    paVar9 = archive_string_ensure((archive_string *)buff,sVar8 + 2);
    if (paVar9 == (archive_string *)0x0) {
      archive_set_error(&a->archive,0xc,"Can\'t allocate v7tar data");
      archive_string_free((archive_string *)buff);
      return -0x1e;
    }
    buff[8] = '\0';
    buff[9] = '\0';
    buff[10] = '\0';
    buff[0xb] = '\0';
    buff[0xc] = '\0';
    buff[0xd] = '\0';
    buff[0xe] = '\0';
    buff[0xf] = '\0';
    archive_strncat((archive_string *)buff,pcVar7,sVar8);
    archive_strappend_char((archive_string *)buff,'/');
    archive_entry_copy_pathname(entry,(char *)buff._0_8_);
    archive_string_free((archive_string *)buff);
  }
  memcpy(buff,"",0x200);
  wVar5 = _archive_entry_pathname_l(entry,&local_240,&copy_length,sc);
  if (wVar5 == L'\0') {
    iVar15 = 0;
LAB_00172bf9:
    if (copy_length < 100) {
      memcpy(buff,local_240,copy_length);
    }
    else {
      iVar15 = -0x19;
      archive_set_error(&a->archive,0x24,"Pathname too long");
    }
    wVar5 = _archive_entry_hardlink_l(entry,&p,&copy_length,sc);
    if (wVar5 == L'\0') {
LAB_00172c79:
      sVar2 = copy_length;
      if (copy_length == 0) {
        wVar5 = _archive_entry_symlink_l(entry,&p,&copy_length,sc);
        if (wVar5 != L'\0') {
          piVar10 = __errno_location();
          pcVar7 = p;
          if (*piVar10 == 0xc) goto LAB_00172cae;
          pcVar11 = archive_string_conversion_charset_name(sc);
          archive_set_error(&a->archive,0x54,"Can\'t translate linkname \'%s\' to %s",pcVar7,pcVar11
                           );
          iVar15 = -0x14;
        }
        cVar16 = -1;
        cVar3 = -1;
        if (copy_length != 0) goto LAB_00172d01;
      }
      else {
        cVar3 = '1';
LAB_00172d01:
        cVar16 = cVar3;
        if (99 < copy_length) {
          archive_set_error(&a->archive,0x24,"Link contents too long");
          copy_length = 100;
          iVar15 = -0x19;
        }
        memcpy(buff + 0x9d,p,copy_length);
      }
      mVar4 = archive_entry_mode(entry);
      iVar6 = format_octal((ulong)(mVar4 & 0xfff),buff + 100,6);
      if (iVar6 != 0) {
        archive_set_error(&a->archive,0x22,"Numeric mode too large");
        iVar15 = -0x19;
      }
      lVar12 = archive_entry_uid(entry);
      iVar6 = format_octal(lVar12,buff + 0x6c,6);
      if (iVar6 != 0) {
        archive_set_error(&a->archive,0x22,"Numeric user ID too large");
        iVar15 = -0x19;
      }
      lVar12 = archive_entry_gid(entry);
      iVar6 = format_octal(lVar12,buff + 0x74,6);
      if (iVar6 != 0) {
        archive_set_error(&a->archive,0x22,"Numeric group ID too large");
        iVar15 = -0x19;
      }
      lVar12 = archive_entry_size(entry);
      iVar6 = format_octal(lVar12,buff + 0x7c,0xb);
      if (iVar6 != 0) {
        archive_set_error(&a->archive,0x22,"File size out of range");
        iVar15 = -0x19;
      }
      v = archive_entry_mtime(entry);
      iVar6 = format_octal(v,buff + 0x88,0xb);
      if (iVar6 != 0) {
        archive_set_error(&a->archive,0x22,"File modification time too large");
        iVar15 = -0x19;
      }
      if (sVar2 == 0) {
        mVar4 = archive_entry_filetype(entry);
        if ((mVar4 != 0x4000) && (mVar4 != 0x8000)) {
          if (mVar4 == 0xa000) {
            buff[0x9c] = '2';
          }
          else {
            __archive_write_entry_filetype_unsupported(&a->archive,entry,"v7tar");
            iVar15 = -0x19;
          }
        }
      }
      else {
        buff[0x9c] = cVar16;
      }
      uVar14 = 0;
      for (lVar13 = 0; lVar13 != 0x200; lVar13 = lVar13 + 1) {
        uVar14 = uVar14 + (byte)buff[lVar13];
      }
      format_octal((ulong)uVar14,buff + 0x94,6);
      buff[0x9a] = '\0';
      if (-0x15 < iVar15) {
        iVar6 = __archive_write_output(a,buff,0x200);
        if (iVar6 < -0x14) {
          archive_entry_free((archive_entry *)0x0);
          return iVar6;
        }
        if (iVar6 < iVar15) {
          iVar15 = iVar6;
        }
        lVar12 = archive_entry_size(entry);
        *plVar1 = lVar12;
        plVar1[1] = (ulong)(-(int)lVar12 & 0x1ff);
      }
      goto LAB_00172efd;
    }
    piVar10 = __errno_location();
    pcVar7 = p;
    if (*piVar10 != 0xc) {
      pcVar11 = archive_string_conversion_charset_name(sc);
      archive_set_error(&a->archive,0x54,"Can\'t translate linkname \'%s\' to %s",pcVar7,pcVar11);
      iVar15 = -0x14;
      goto LAB_00172c79;
    }
LAB_00172cae:
    pcVar7 = "Can\'t allocate memory for Linkname";
  }
  else {
    piVar10 = __errno_location();
    pcVar7 = local_240;
    if (*piVar10 != 0xc) {
      iVar15 = -0x14;
      pcVar11 = archive_string_conversion_charset_name(sc);
      archive_set_error(&a->archive,0x54,"Can\'t translate pathname \'%s\' to %s",pcVar7,pcVar11);
      goto LAB_00172bf9;
    }
    pcVar7 = "Can\'t allocate memory for Pathname";
  }
  archive_set_error(&a->archive,0xc,pcVar7);
  iVar15 = -0x1e;
LAB_00172efd:
  archive_entry_free((archive_entry *)0x0);
  return iVar15;
}

Assistant:

static int
archive_write_v7tar_header(struct archive_write *a, struct archive_entry *entry)
{
	char buff[512];
	int ret, ret2;
	struct v7tar *v7tar;
	struct archive_entry *entry_main;
	struct archive_string_conv *sconv;

	v7tar = (struct v7tar *)a->format_data;

	/* Setup default string conversion. */
	if (v7tar->opt_sconv == NULL) {
		if (!v7tar->init_default_conversion) {
			v7tar->sconv_default =
			    archive_string_default_conversion_for_write(
				&(a->archive));
			v7tar->init_default_conversion = 1;
		}
		sconv = v7tar->sconv_default;
	} else
		sconv = v7tar->opt_sconv;

	/* Sanity check. */
	if (archive_entry_pathname(entry) == NULL) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
		    "Can't record entry in tar file without pathname");
		return (ARCHIVE_FAILED);
	}

	/* Only regular files (not hardlinks) have data. */
	if (archive_entry_hardlink(entry) != NULL ||
	    archive_entry_symlink(entry) != NULL ||
	    !(archive_entry_filetype(entry) == AE_IFREG))
		archive_entry_set_size(entry, 0);

	if (AE_IFDIR == archive_entry_filetype(entry)) {
		const char *p;
		size_t path_length;
		/*
		 * Ensure a trailing '/'.  Modify the entry so
		 * the client sees the change.
		 */
#if defined(_WIN32) && !defined(__CYGWIN__)
		const wchar_t *wp;

		wp = archive_entry_pathname_w(entry);
		if (wp != NULL && wp[wcslen(wp) -1] != L'/') {
			struct archive_wstring ws;

			archive_string_init(&ws);
			path_length = wcslen(wp);
			if (archive_wstring_ensure(&ws,
			    path_length + 2) == NULL) {
				archive_set_error(&a->archive, ENOMEM,
				    "Can't allocate v7tar data");
				archive_wstring_free(&ws);
				return(ARCHIVE_FATAL);
			}
			/* Should we keep '\' ? */
			if (wp[path_length -1] == L'\\')
				path_length--;
			archive_wstrncpy(&ws, wp, path_length);
			archive_wstrappend_wchar(&ws, L'/');
			archive_entry_copy_pathname_w(entry, ws.s);
			archive_wstring_free(&ws);
			p = NULL;
		} else
#endif
			p = archive_entry_pathname(entry);
		/*
		 * On Windows, this is a backup operation just in
		 * case getting WCS failed. On POSIX, this is a
		 * normal operation.
		 */
		if (p != NULL && p[0] != '\0' && p[strlen(p) - 1] != '/') {
			struct archive_string as;

			archive_string_init(&as);
			path_length = strlen(p);
			if (archive_string_ensure(&as,
			    path_length + 2) == NULL) {
				archive_set_error(&a->archive, ENOMEM,
				    "Can't allocate v7tar data");
				archive_string_free(&as);
				return(ARCHIVE_FATAL);
			}
#if defined(_WIN32) && !defined(__CYGWIN__)
			/* NOTE: This might break the pathname
			 * if the current code page is CP932 and
			 * the pathname includes a character '\'
			 * as a part of its multibyte pathname. */
			if (p[strlen(p) -1] == '\\')
				path_length--;
			else
#endif
			archive_strncpy(&as, p, path_length);
			archive_strappend_char(&as, '/');
			archive_entry_copy_pathname(entry, as.s);
			archive_string_free(&as);
		}
	}

#if defined(_WIN32) && !defined(__CYGWIN__)
	/* Make sure the path separators in pathname, hardlink and symlink
	 * are all slash '/', not the Windows path separator '\'. */
	entry_main = __la_win_entry_in_posix_pathseparator(entry);
	if (entry_main == NULL) {
		archive_set_error(&a->archive, ENOMEM,
		    "Can't allocate v7tar data");
		return(ARCHIVE_FATAL);
	}
	if (entry != entry_main)
		entry = entry_main;
	else
		entry_main = NULL;
#else
	entry_main = NULL;
#endif
	ret = format_header_v7tar(a, buff, entry, 1, sconv);
	if (ret < ARCHIVE_WARN) {
		archive_entry_free(entry_main);
		return (ret);
	}
	ret2 = __archive_write_output(a, buff, 512);
	if (ret2 < ARCHIVE_WARN) {
		archive_entry_free(entry_main);
		return (ret2);
	}
	if (ret2 < ret)
		ret = ret2;

	v7tar->entry_bytes_remaining = archive_entry_size(entry);
	v7tar->entry_padding = 0x1ff & (-(int64_t)v7tar->entry_bytes_remaining);
	archive_entry_free(entry_main);
	return (ret);
}